

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int *piVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  uint *puVar5;
  uint uVar6;
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  void *pvVar9;
  void *pvVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  int32_t index;
  uint uVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  parasail_result_t *ppVar29;
  __m128i *palVar30;
  __m128i *ptr;
  __m128i *palVar31;
  __m128i *ptr_00;
  __m128i *b;
  __m128i *ptr_01;
  __m128i *b_00;
  __m128i *palVar32;
  __m128i *ptr_02;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  int32_t *ptr_03;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  __m128i *palVar37;
  long lVar38;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  __m128i *palVar39;
  ulong uVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  uint uVar44;
  ulong uVar45;
  long lVar46;
  uint uVar47;
  uint uVar48;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  __m128i alVar60;
  undefined1 auVar61 [16];
  int32_t iVar62;
  uint uVar63;
  int iVar64;
  ulong uVar65;
  uint uVar70;
  uint uVar72;
  uint uVar74;
  undefined1 auVar66 [16];
  int iVar71;
  int iVar73;
  int iVar75;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint uVar76;
  int iVar77;
  uint uVar82;
  uint uVar84;
  undefined1 auVar78 [16];
  int iVar83;
  int iVar85;
  uint uVar86;
  int iVar87;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  __m128i alVar81;
  undefined4 uVar88;
  uint uVar89;
  uint uVar93;
  uint uVar94;
  undefined1 auVar90 [16];
  uint uVar95;
  undefined1 auVar91 [16];
  __m128i alVar92;
  undefined4 uVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  uint uVar100;
  uint uVar104;
  uint uVar105;
  undefined1 in_XMM5 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint uVar106;
  __m128i alVar103;
  undefined4 uVar107;
  __m128i alVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  int iVar117;
  undefined1 in_XMM8 [16];
  int iVar118;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  int iVar125;
  int iVar126;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  undefined1 auVar127 [16];
  int iVar133;
  __m128i alVar134;
  __m128i alVar135;
  __m128i alVar136;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  uint local_214;
  undefined1 local_1e8 [16];
  __m128i *local_1d8;
  __m128i *local_1b8;
  undefined1 local_198 [16];
  uint local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  ulong local_f8;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  size_t len;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar7 = (profile->profile32).score;
    if (pvVar7 == (void *)0x0) {
      parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar6 = profile->s1Len;
        if ((int)uVar6 < 1) {
          parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32_cold_1();
        }
        else {
          uVar47 = uVar6 - 1;
          uVar45 = (ulong)uVar6 + 3;
          uVar40 = uVar45 >> 2;
          uVar49 = (ulong)uVar47 % uVar40;
          iVar28 = (int)(uVar47 / uVar40);
          uVar44 = -open;
          uVar25 = ppVar8->min;
          uVar26 = 0x80000000 - uVar25;
          if (uVar25 != uVar44 && SBORROW4(uVar25,uVar44) == (int)(uVar25 + open) < 0) {
            uVar26 = open | 0x80000000;
          }
          pvVar9 = (profile->profile32).matches;
          uVar25 = 0x7ffffffe - ppVar8->max;
          pvVar10 = (profile->profile32).similar;
          ppVar29 = parasail_result_new_rowcol3((uint)uVar45 & 0x7ffffffc,s2Len);
          if (ppVar29 != (parasail_result_t *)0x0) {
            ppVar29->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar29->flag | 0x4450802;
            palVar30 = parasail_memalign___m128i(0x10,uVar40);
            ptr = parasail_memalign___m128i(0x10,uVar40);
            palVar31 = parasail_memalign___m128i(0x10,uVar40);
            ptr_00 = parasail_memalign___m128i(0x10,uVar40);
            b = parasail_memalign___m128i(0x10,uVar40);
            ptr_01 = parasail_memalign___m128i(0x10,uVar40);
            b_00 = parasail_memalign___m128i(0x10,uVar40);
            palVar32 = parasail_memalign___m128i(0x10,uVar40);
            ptr_02 = parasail_memalign___m128i(0x10,uVar40);
            b_01 = parasail_memalign___m128i(0x10,uVar40);
            b_02 = parasail_memalign___m128i(0x10,uVar40);
            b_03 = parasail_memalign___m128i(0x10,uVar40);
            ptr_03 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            auVar97 = (undefined1  [16])0x0;
            alVar134[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            alVar134[1]._0_1_ = b_02 == (__m128i *)0x0;
            auVar50._0_8_ = -(ulong)(palVar30 == (__m128i *)0x0);
            auVar50._8_8_ = -(ulong)(ptr == (__m128i *)0x0);
            auVar78._0_8_ = -(ulong)(palVar31 == (__m128i *)0x0);
            auVar78._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
            auVar50 = packssdw(auVar50,auVar78);
            auVar101._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar101._8_8_ = -(ulong)(ptr_01 == (__m128i *)0x0);
            auVar112._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar112._8_8_ = -(ulong)(palVar32 == (__m128i *)0x0);
            auVar78 = packssdw(auVar101,auVar112);
            auVar50 = packssdw(auVar50,auVar78);
            if (((((b_01 != (__m128i *)0x0 && ptr_02 != (__m128i *)0x0) && b_02 != (__m128i *)0x0)
                 && b_03 != (__m128i *)0x0) && ptr_03 != (int32_t *)0x0) &&
                ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                              (auVar50 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar50 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar50 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar50 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar50 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar50 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar50 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar50 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar50 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar50 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar50 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar50[0xf])) {
              iVar1 = s2Len + -1;
              uVar35 = 3 - iVar28;
              len = (size_t)uVar35;
              uVar26 = uVar26 + 1;
              alVar134[0] = uVar40;
              parasail_memset___m128i(palVar31,alVar134,len);
              alVar135[1] = extraout_RDX_00;
              alVar135[0] = uVar40;
              parasail_memset___m128i(b,alVar135,len);
              alVar136[1] = extraout_RDX_01;
              alVar136[0] = uVar40;
              parasail_memset___m128i(b_00,alVar136,len);
              c[1] = extraout_RDX_02;
              c[0] = uVar40;
              parasail_memset___m128i(b_01,c,len);
              c_00[1] = extraout_RDX_03;
              c_00[0] = uVar40;
              parasail_memset___m128i(b_02,c_00,len);
              c_01[1] = extraout_RDX_04;
              c_01[0] = uVar40;
              parasail_memset___m128i(b_03,c_01,len);
              auVar110._4_4_ = uVar44;
              auVar110._0_4_ = uVar44;
              auVar110._8_4_ = uVar44;
              auVar110._12_4_ = uVar44;
              local_f8 = CONCAT44(0,open);
              auVar124._8_4_ = open;
              auVar124._0_8_ = local_f8;
              auVar124._12_4_ = 0;
              uVar48 = (uint)uVar40;
              auVar90._8_4_ = uVar48;
              auVar90._0_8_ = uVar40;
              auVar90._12_4_ = 0;
              auVar50 = pmovsxbq(auVar97,0x302);
              auVar78 = pmuldq(auVar50,auVar90);
              auVar50 = pmuldq(auVar90,_DAT_00903a90);
              uVar33 = 0;
              auVar101 = pmovsxdq(in_XMM5,0x8000000080000000);
              palVar37 = palVar30;
              palVar39 = ptr_02;
              do {
                if (s1_beg == 0) {
                  auVar51._8_4_ = (int)uVar33;
                  auVar51._0_8_ = uVar33;
                  auVar51._12_4_ = (int)(uVar33 >> 0x20);
                  auVar52._0_4_ = (undefined4)(uVar33 + auVar50._0_8_);
                  auVar52._4_4_ = (int)(auVar51._8_8_ + auVar50._8_8_);
                  auVar52._8_4_ = (int)(auVar78._0_8_ + uVar33);
                  auVar52._12_4_ = (int)(auVar78._8_8_ + auVar51._8_8_);
                  auVar97._4_4_ = gap;
                  auVar97._0_4_ = gap;
                  auVar97._8_4_ = gap;
                  auVar97._12_4_ = gap;
                  auVar112 = pmulld(auVar52,auVar97);
                  alVar108[0]._0_4_ = uVar44 - auVar112._0_4_;
                  alVar108[0]._4_4_ = uVar44 - auVar112._4_4_;
                  alVar108[1]._0_4_ = uVar44 - auVar112._8_4_;
                  alVar108[1]._4_4_ = uVar44 - auVar112._12_4_;
                }
                else {
                  alVar108[0] = 0;
                  alVar108[1] = 0;
                }
                auVar112 = pmovsxdq(in_XMM7,(undefined1  [16])alVar108);
                auVar53._0_8_ = alVar108[1];
                auVar53._8_4_ = (int)alVar108[1];
                auVar53._12_4_ = alVar108[1]._4_4_;
                auVar97 = pmovsxdq(in_XMM8,auVar53);
                in_XMM8._0_8_ = auVar97._0_8_ - local_f8;
                in_XMM8._8_8_ = auVar97._8_8_ - (ulong)(uint)open;
                auVar113._0_8_ = auVar112._0_8_ - local_f8;
                auVar113._8_8_ = auVar112._8_8_ - (ulong)(uint)open;
                auVar54._0_8_ = -(ulong)(auVar101._0_8_ < auVar113._0_8_);
                auVar54._8_8_ = -(ulong)(auVar101._8_8_ < auVar113._8_8_);
                auVar112 = blendvpd(auVar101,auVar113,auVar54);
                auVar55._0_8_ = -(ulong)(auVar101._0_8_ < in_XMM8._0_8_);
                auVar55._8_8_ = -(ulong)(auVar101._8_8_ < in_XMM8._8_8_);
                in_XMM7 = blendvpd(auVar101,in_XMM8,auVar55);
                *palVar37 = alVar108;
                *(int *)*palVar39 = auVar112._0_4_;
                *(int *)((long)*palVar39 + 4) = auVar112._8_4_;
                *(int *)(*palVar39 + 1) = in_XMM7._0_4_;
                *(int *)((long)*palVar39 + 0xc) = in_XMM7._8_4_;
                uVar33 = uVar33 + 1;
                palVar39 = palVar39 + 1;
                palVar37 = palVar37 + 1;
              } while (uVar40 != uVar33);
              *ptr_03 = 0;
              auVar50 = _DAT_00906ca0;
              lVar34 = (ulong)(uint)s2Len - 1;
              auVar56._8_4_ = (int)lVar34;
              auVar56._0_8_ = lVar34;
              auVar56._12_4_ = (int)((ulong)lVar34 >> 0x20);
              auVar78 = pmovsxbq(auVar110,0x302);
              auVar101 = pmovsxbq(auVar124,0x100);
              auVar56 = auVar56 ^ _DAT_00906ca0;
              uVar33 = 0;
              auVar68._12_4_ = uVar44;
              do {
                auVar116._8_8_ = auVar50._0_8_;
                lVar34 = auVar56._0_8_;
                if ((bool)(~(lVar34 < (long)(uVar33 ^ auVar116._8_8_)) & 1)) {
                  uVar36 = 0;
                  if (s2_beg == 0) {
                    uVar36 = auVar68._12_4_;
                  }
                  ptr_03[uVar33 + 1] = uVar36;
                }
                auVar102._8_4_ = (int)uVar33;
                auVar102._0_8_ = uVar33;
                auVar102._12_4_ = (int)(uVar33 >> 0x20);
                if ((long)((auVar102._8_8_ | auVar101._8_8_) ^ auVar50._8_8_) <= auVar56._8_8_) {
                  iVar41 = auVar68._12_4_ - gap;
                  if (s2_beg != 0) {
                    iVar41 = 0;
                  }
                  ptr_03[uVar33 + 2] = iVar41;
                }
                bVar11 = (long)((uVar33 | auVar78._0_8_) ^ auVar116._8_8_) <= lVar34;
                if (bVar11) {
                  iVar41 = gap * -2 + auVar68._12_4_;
                  if (s2_beg != 0) {
                    iVar41 = 0;
                  }
                  ptr_03[uVar33 + 3] = iVar41;
                }
                if (bVar11) {
                  iVar41 = gap * -3 + auVar68._12_4_;
                  if (s2_beg != 0) {
                    iVar41 = 0;
                  }
                  ptr_03[uVar33 + 4] = iVar41;
                }
                uVar33 = uVar33 + 4;
                auVar68._12_4_ = auVar68._12_4_ + gap * -4;
              } while ((s2Len + 3U & 0xfffffffc) != uVar33);
              uVar36 = uVar48 - 1;
              uVar33 = 0;
              auVar68._4_4_ = uVar26;
              auVar68._0_4_ = uVar26;
              auVar68._8_4_ = uVar26;
              auVar68._12_4_ = uVar26;
              auVar98 = auVar68;
              auVar50 = auVar68;
              auVar116 = auVar68;
              auVar120 = auVar68;
              iVar41 = iVar1;
              local_188 = uVar25;
              uStack_184 = uVar25;
              uStack_180 = uVar25;
              uStack_17c = uVar25;
              do {
                local_1b8 = ptr_01;
                local_1d8 = ptr;
                ptr_01 = b;
                palVar39 = b_00;
                b_00 = palVar32;
                palVar37 = ptr_00;
                ptr_00 = palVar31;
                ptr = palVar30;
                palVar30 = ptr + uVar36;
                palVar31 = ptr_00 + uVar36;
                iVar133 = (int)(*palVar31)[0];
                iVar117 = *(int *)((long)*palVar31 + 4);
                iVar118 = (int)(*palVar31)[1];
                palVar31 = ptr_01 + uVar36;
                iVar77 = (int)(*palVar31)[0];
                iVar83 = *(int *)((long)*palVar31 + 4);
                iVar85 = (int)(*palVar31)[1];
                palVar31 = palVar39 + uVar36;
                iVar128 = (int)(*palVar31)[0];
                iVar130 = *(int *)((long)*palVar31 + 4);
                iVar132 = (int)(*palVar31)[1];
                iVar87 = 0;
                iVar131 = 0;
                palVar31 = ptr + uVar36;
                iVar27 = (int)(*palVar31)[0];
                iVar126 = *(int *)((long)*palVar31 + 4);
                iVar129 = (int)(*palVar31)[1];
                iVar125 = 0;
                iVar62 = ptr_03[uVar33];
                lVar46 = (long)ppVar8->mapper[(byte)s2[uVar33]] * uVar40 * 0x10;
                palVar31 = (__m128i *)(lVar46 + (long)pvVar10);
                local_198 = (undefined1  [16])0x0;
                lVar34 = 0;
                local_1e8 = (undefined1  [16])0x0;
                auVar122 = _DAT_00905160;
                uVar100 = uVar26;
                uVar104 = uVar26;
                uVar105 = uVar26;
                uVar106 = uVar26;
                do {
                  piVar2 = (int *)((long)*ptr_02 + lVar34);
                  iVar64 = *piVar2;
                  iVar71 = piVar2[1];
                  iVar73 = piVar2[2];
                  iVar75 = piVar2[3];
                  auVar78 = *(undefined1 (*) [16])((long)*b_01 + lVar34);
                  auVar101 = *(undefined1 (*) [16])((long)*b_02 + lVar34);
                  auVar112 = *(undefined1 (*) [16])((long)*b_03 + lVar34);
                  piVar2 = (int *)((long)pvVar7 + lVar34 + lVar46);
                  uVar63 = iVar62 + *piVar2;
                  uVar70 = iVar27 + piVar2[1];
                  uVar72 = iVar126 + piVar2[2];
                  uVar74 = iVar129 + piVar2[3];
                  uVar89 = (uint)((int)uVar63 < iVar64) * iVar64 | ((int)uVar63 >= iVar64) * uVar63;
                  uVar93 = (uint)((int)uVar70 < iVar71) * iVar71 | ((int)uVar70 >= iVar71) * uVar70;
                  uVar94 = (uint)((int)uVar72 < iVar73) * iVar73 | ((int)uVar72 >= iVar73) * uVar72;
                  uVar95 = (uint)((int)uVar74 < iVar75) * iVar75 | ((int)uVar74 >= iVar75) * uVar74;
                  uVar76 = ((int)uVar89 < (int)uVar100) * uVar100 |
                           ((int)uVar89 >= (int)uVar100) * uVar89;
                  uVar82 = ((int)uVar93 < (int)uVar104) * uVar104 |
                           ((int)uVar93 >= (int)uVar104) * uVar93;
                  uVar84 = ((int)uVar94 < (int)uVar105) * uVar105 |
                           ((int)uVar94 >= (int)uVar105) * uVar94;
                  uVar86 = ((int)uVar95 < (int)uVar106) * uVar106 |
                           ((int)uVar95 >= (int)uVar106) * uVar95;
                  puVar5 = (uint *)((long)*local_1d8 + lVar34);
                  *puVar5 = uVar76;
                  puVar5[1] = uVar82;
                  puVar5[2] = uVar84;
                  puVar5[3] = uVar86;
                  auVar91._0_4_ = -(uint)((int)uVar100 < (int)uVar89);
                  auVar91._4_4_ = -(uint)((int)uVar104 < (int)uVar93);
                  auVar91._8_4_ = -(uint)((int)uVar105 < (int)uVar94);
                  auVar91._12_4_ = -(uint)((int)uVar106 < (int)uVar95);
                  auVar97 = blendvps(local_1e8,auVar78,auVar91);
                  piVar2 = (int *)((long)pvVar9 + lVar34 + lVar46);
                  auVar115._0_4_ = iVar87 + *piVar2;
                  auVar115._4_4_ = iVar133 + piVar2[1];
                  auVar115._8_4_ = iVar117 + piVar2[2];
                  auVar115._12_4_ = iVar118 + piVar2[3];
                  auVar66._0_4_ = -(uint)(uVar63 == uVar76);
                  auVar66._4_4_ = -(uint)(uVar70 == uVar82);
                  auVar66._8_4_ = -(uint)(uVar72 == uVar84);
                  auVar66._12_4_ = -(uint)(uVar74 == uVar86);
                  auVar124 = blendvps(auVar97,auVar115,auVar66);
                  *(undefined1 (*) [16])((long)*palVar37 + lVar34) = auVar124;
                  auVar97 = blendvps(local_198,auVar101,auVar91);
                  piVar2 = (int *)((long)*palVar31 + lVar34);
                  auVar109._0_4_ = iVar131 + *piVar2;
                  auVar109._4_4_ = iVar77 + piVar2[1];
                  auVar109._8_4_ = iVar83 + piVar2[2];
                  auVar109._12_4_ = iVar85 + piVar2[3];
                  auVar97 = blendvps(auVar97,auVar109,auVar66);
                  *(undefined1 (*) [16])((long)*local_1b8 + lVar34) = auVar97;
                  auVar110 = blendvps(auVar122,auVar112,auVar91);
                  auVar127._0_4_ = iVar125 + 1;
                  auVar127._4_4_ = iVar128 + 1;
                  auVar127._8_4_ = iVar130 + 1;
                  auVar127._12_4_ = iVar132 + 1;
                  auVar110 = blendvps(auVar110,auVar127,auVar66);
                  *(undefined1 (*) [16])((long)*b_00 + lVar34) = auVar110;
                  local_188 = ((int)uVar76 < (int)local_188) * uVar76 |
                              ((int)uVar76 >= (int)local_188) * local_188;
                  uStack_184 = ((int)uVar82 < (int)uStack_184) * uVar82 |
                               ((int)uVar82 >= (int)uStack_184) * uStack_184;
                  uStack_180 = ((int)uVar84 < (int)uStack_180) * uVar84 |
                               ((int)uVar84 >= (int)uStack_180) * uStack_180;
                  uStack_17c = ((int)uVar86 < (int)uStack_17c) * uVar86 |
                               ((int)uVar86 >= (int)uStack_17c) * uStack_17c;
                  iVar27 = auVar98._0_4_;
                  uVar63 = (iVar27 < (int)uVar76) * uVar76 | (uint)(iVar27 >= (int)uVar76) * iVar27;
                  iVar27 = auVar98._4_4_;
                  uVar72 = (iVar27 < (int)uVar82) * uVar82 | (uint)(iVar27 >= (int)uVar82) * iVar27;
                  iVar27 = auVar98._8_4_;
                  iVar126 = auVar98._12_4_;
                  uVar89 = (iVar27 < (int)uVar84) * uVar84 | (uint)(iVar27 >= (int)uVar84) * iVar27;
                  uVar94 = (iVar126 < (int)uVar86) * uVar86 |
                           (uint)(iVar126 >= (int)uVar86) * iVar126;
                  iVar129 = auVar97._4_4_;
                  iVar77 = auVar97._12_4_;
                  iVar27 = auVar110._0_4_;
                  iVar126 = auVar97._0_4_;
                  uVar70 = (uint)(iVar126 < iVar27) * iVar27 | (uint)(iVar126 >= iVar27) * iVar126;
                  iVar126 = auVar110._4_4_;
                  uVar74 = (uint)(iVar129 < iVar126) * iVar126 |
                           (uint)(iVar129 >= iVar126) * iVar129;
                  iVar129 = auVar110._8_4_;
                  iVar131 = auVar97._8_4_;
                  uVar93 = (uint)(iVar131 < iVar129) * iVar129 |
                           (uint)(iVar131 >= iVar129) * iVar131;
                  iVar131 = auVar110._12_4_;
                  uVar95 = (uint)(iVar77 < iVar131) * iVar131 | (uint)(iVar77 >= iVar131) * iVar77;
                  iVar77 = uVar76 - open;
                  iVar83 = uVar82 - open;
                  iVar85 = uVar84 - open;
                  iVar87 = uVar86 - open;
                  iVar64 = iVar64 - gap;
                  iVar71 = iVar71 - gap;
                  iVar73 = iVar73 - gap;
                  iVar75 = iVar75 - gap;
                  auVar57._0_4_ = -(uint)(iVar64 < iVar77);
                  auVar57._4_4_ = -(uint)(iVar71 < iVar83);
                  auVar57._8_4_ = -(uint)(iVar73 < iVar85);
                  auVar57._12_4_ = -(uint)(iVar75 < iVar87);
                  auVar78 = blendvps(auVar78,auVar124,auVar57);
                  auVar110 = blendvps(auVar101,auVar97,auVar57);
                  auVar119._0_4_ = auVar112._0_4_ + 1;
                  auVar119._4_4_ = auVar112._4_4_ + 1;
                  auVar119._8_4_ = auVar112._8_4_ + 1;
                  auVar119._12_4_ = auVar112._12_4_ + 1;
                  auVar111._0_4_ = iVar27 + 1;
                  auVar111._4_4_ = iVar126 + 1;
                  auVar111._8_4_ = iVar129 + 1;
                  auVar111._12_4_ = iVar131 + 1;
                  auVar101 = blendvps(auVar119,auVar111,auVar57);
                  iVar126 = uVar100 - gap;
                  iVar129 = uVar104 - gap;
                  iVar131 = uVar105 - gap;
                  iVar133 = uVar106 - gap;
                  auVar79._0_4_ = -(uint)(iVar126 < iVar77);
                  auVar79._4_4_ = -(uint)(iVar129 < iVar83);
                  auVar79._8_4_ = -(uint)(iVar131 < iVar85);
                  auVar79._12_4_ = -(uint)(iVar133 < iVar87);
                  local_1e8 = blendvps(local_1e8,auVar124,auVar79);
                  iVar27 = auVar124._0_4_;
                  uVar100 = (uint)((int)uVar63 < iVar27) * iVar27 | ((int)uVar63 >= iVar27) * uVar63
                  ;
                  iVar27 = auVar124._4_4_;
                  uVar104 = (uint)((int)uVar72 < iVar27) * iVar27 | ((int)uVar72 >= iVar27) * uVar72
                  ;
                  iVar27 = auVar124._8_4_;
                  uVar105 = (uint)((int)uVar89 < iVar27) * iVar27 | ((int)uVar89 >= iVar27) * uVar89
                  ;
                  iVar27 = auVar124._12_4_;
                  uVar106 = (uint)((int)uVar94 < iVar27) * iVar27 | ((int)uVar94 >= iVar27) * uVar94
                  ;
                  auVar98._0_4_ =
                       ((int)uVar70 < (int)uVar100) * uVar100 |
                       ((int)uVar70 >= (int)uVar100) * uVar70;
                  auVar98._4_4_ =
                       ((int)uVar74 < (int)uVar104) * uVar104 |
                       ((int)uVar74 >= (int)uVar104) * uVar74;
                  auVar98._8_4_ =
                       ((int)uVar93 < (int)uVar105) * uVar105 |
                       ((int)uVar93 >= (int)uVar105) * uVar93;
                  auVar98._12_4_ =
                       ((int)uVar95 < (int)uVar106) * uVar106 |
                       ((int)uVar95 >= (int)uVar106) * uVar95;
                  puVar5 = (uint *)((long)*ptr_02 + lVar34);
                  *puVar5 = (uint)(iVar77 < iVar64) * iVar64 | (uint)(iVar77 >= iVar64) * iVar77;
                  puVar5[1] = (uint)(iVar83 < iVar71) * iVar71 | (uint)(iVar83 >= iVar71) * iVar83;
                  puVar5[2] = (uint)(iVar85 < iVar73) * iVar73 | (uint)(iVar85 >= iVar73) * iVar85;
                  puVar5[3] = (uint)(iVar87 < iVar75) * iVar75 | (uint)(iVar87 >= iVar75) * iVar87;
                  *(undefined1 (*) [16])((long)*b_01 + lVar34) = auVar78;
                  *(undefined1 (*) [16])((long)*b_02 + lVar34) = auVar110;
                  *(undefined1 (*) [16])((long)*b_03 + lVar34) = auVar101;
                  uVar100 = (uint)(iVar77 < iVar126) * iVar126 | (uint)(iVar77 >= iVar126) * iVar77;
                  uVar104 = (uint)(iVar83 < iVar129) * iVar129 | (uint)(iVar83 >= iVar129) * iVar83;
                  uVar105 = (uint)(iVar85 < iVar131) * iVar131 | (uint)(iVar85 >= iVar131) * iVar85;
                  uVar106 = (uint)(iVar87 < iVar133) * iVar133 | (uint)(iVar87 >= iVar133) * iVar87;
                  local_198 = blendvps(local_198,auVar97,auVar79);
                  auVar121._0_4_ = auVar122._0_4_ + 1;
                  auVar121._4_4_ = auVar122._4_4_ + 1;
                  auVar121._8_4_ = auVar122._8_4_ + 1;
                  auVar121._12_4_ = auVar122._12_4_ + 1;
                  auVar122 = blendvps(auVar121,auVar111,auVar79);
                  piVar2 = (int *)((long)*ptr + lVar34);
                  iVar62 = *piVar2;
                  iVar27 = piVar2[1];
                  iVar126 = piVar2[2];
                  iVar129 = piVar2[3];
                  piVar2 = (int *)((long)*ptr_00 + lVar34);
                  iVar87 = *piVar2;
                  iVar133 = piVar2[1];
                  iVar117 = piVar2[2];
                  iVar118 = piVar2[3];
                  piVar2 = (int *)((long)*ptr_01 + lVar34);
                  iVar131 = *piVar2;
                  iVar77 = piVar2[1];
                  iVar83 = piVar2[2];
                  iVar85 = piVar2[3];
                  piVar2 = (int *)((long)*palVar39 + lVar34);
                  iVar125 = *piVar2;
                  iVar128 = piVar2[1];
                  iVar130 = piVar2[2];
                  iVar132 = piVar2[3];
                  lVar34 = lVar34 + 0x10;
                } while (uVar40 << 4 != lVar34);
                iVar27 = 0;
                do {
                  iVar126 = (int)(*palVar30)[0];
                  iVar129 = *(int *)((long)*palVar30 + 4);
                  iVar131 = (int)(*palVar30)[1];
                  uVar106 = uVar44;
                  if (s2_beg == 0) {
                    uVar106 = ptr_03[uVar33 + 1] - open;
                  }
                  iVar62 = ptr_03[uVar33];
                  auVar123._0_4_ = auVar122._0_4_;
                  auVar123._4_4_ = auVar123._0_4_;
                  auVar123._8_4_ = auVar122._4_4_;
                  auVar123._12_4_ = auVar122._8_4_;
                  auVar122._8_8_ = auVar123._8_8_;
                  auVar122._0_8_ = (ulong)auVar123._0_4_ << 0x20 | 1;
                  lVar34 = local_1e8._8_8_;
                  alVar60[1] = local_1e8._0_8_;
                  local_1e8._0_8_ = alVar60[1] << 0x20;
                  local_1e8._8_8_ = lVar34 << 0x20 | alVar60[1] >> 0x20;
                  lVar34 = local_198._8_8_;
                  alVar60[1] = local_198._0_8_;
                  local_198._0_8_ = alVar60[1] << 0x20;
                  local_198._8_8_ = lVar34 << 0x20 | alVar60[1] >> 0x20;
                  lVar34 = 0;
                  uVar63 = uVar100;
                  uVar70 = uVar104;
                  uVar72 = uVar105;
                  do {
                    piVar2 = (int *)((long)pvVar7 + lVar34 + lVar46);
                    iVar77 = *piVar2;
                    iVar83 = piVar2[1];
                    iVar85 = piVar2[2];
                    iVar87 = piVar2[3];
                    piVar2 = (int *)((long)*local_1d8 + lVar34);
                    iVar133 = *piVar2;
                    iVar117 = piVar2[1];
                    iVar118 = piVar2[2];
                    iVar125 = piVar2[3];
                    uVar76 = (iVar133 < (int)uVar106) * uVar106 |
                             (uint)(iVar133 >= (int)uVar106) * iVar133;
                    uVar82 = (iVar117 < (int)uVar63) * uVar63 |
                             (uint)(iVar117 >= (int)uVar63) * iVar117;
                    uVar84 = (iVar118 < (int)uVar70) * uVar70 |
                             (uint)(iVar118 >= (int)uVar70) * iVar118;
                    uVar86 = (iVar125 < (int)uVar72) * uVar72 |
                             (uint)(iVar125 >= (int)uVar72) * iVar125;
                    puVar5 = (uint *)((long)*local_1d8 + lVar34);
                    *puVar5 = uVar76;
                    puVar5[1] = uVar82;
                    puVar5[2] = uVar84;
                    puVar5[3] = uVar86;
                    auVar80._0_4_ = -(uint)(iVar62 + iVar77 == uVar76);
                    auVar80._4_4_ = -(uint)(iVar126 + iVar83 == uVar82);
                    auVar80._8_4_ = -(uint)(iVar129 + iVar85 == uVar84);
                    auVar80._12_4_ = -(uint)(iVar131 + iVar87 == uVar86);
                    auVar58._0_4_ = -(uint)((int)uVar106 < iVar133);
                    auVar58._4_4_ = -(uint)((int)uVar63 < iVar117);
                    auVar58._8_4_ = -(uint)((int)uVar70 < iVar118);
                    auVar58._12_4_ = -(uint)((int)uVar72 < iVar125);
                    auVar58 = auVar58 | auVar80;
                    auVar78 = blendvps(local_1e8,*(undefined1 (*) [16])((long)*palVar37 + lVar34),
                                       auVar58);
                    *(undefined1 (*) [16])((long)*palVar37 + lVar34) = auVar78;
                    auVar101 = blendvps(local_198,*(undefined1 (*) [16])((long)*local_1b8 + lVar34),
                                        auVar58);
                    *(undefined1 (*) [16])((long)*local_1b8 + lVar34) = auVar101;
                    auVar112 = blendvps(auVar122,*(undefined1 (*) [16])((long)*b_00 + lVar34),
                                        auVar58);
                    *(undefined1 (*) [16])((long)*b_00 + lVar34) = auVar112;
                    local_188 = ((int)uVar76 < (int)local_188) * uVar76 |
                                ((int)uVar76 >= (int)local_188) * local_188;
                    uStack_184 = ((int)uVar82 < (int)uStack_184) * uVar82 |
                                 ((int)uVar82 >= (int)uStack_184) * uStack_184;
                    uStack_180 = ((int)uVar84 < (int)uStack_180) * uVar84 |
                                 ((int)uVar84 >= (int)uStack_180) * uStack_180;
                    uStack_17c = ((int)uVar86 < (int)uStack_17c) * uVar86 |
                                 ((int)uVar86 >= (int)uStack_17c) * uStack_17c;
                    iVar126 = auVar98._0_4_;
                    uVar100 = (iVar126 < (int)uVar76) * uVar76 |
                              (uint)(iVar126 >= (int)uVar76) * iVar126;
                    iVar126 = auVar98._4_4_;
                    uVar104 = (iVar126 < (int)uVar82) * uVar82 |
                              (uint)(iVar126 >= (int)uVar82) * iVar126;
                    iVar126 = auVar98._8_4_;
                    iVar129 = auVar98._12_4_;
                    uVar105 = (iVar126 < (int)uVar84) * uVar84 |
                              (uint)(iVar126 >= (int)uVar84) * iVar126;
                    uVar74 = (iVar129 < (int)uVar86) * uVar86 |
                             (uint)(iVar129 >= (int)uVar86) * iVar129;
                    iVar126 = auVar78._0_4_;
                    uVar100 = (uint)((int)uVar100 < iVar126) * iVar126 |
                              ((int)uVar100 >= iVar126) * uVar100;
                    iVar126 = auVar78._4_4_;
                    uVar104 = (uint)((int)uVar104 < iVar126) * iVar126 |
                              ((int)uVar104 >= iVar126) * uVar104;
                    iVar126 = auVar78._8_4_;
                    uVar105 = (uint)((int)uVar105 < iVar126) * iVar126 |
                              ((int)uVar105 >= iVar126) * uVar105;
                    iVar126 = auVar78._12_4_;
                    uVar74 = (uint)((int)uVar74 < iVar126) * iVar126 |
                             ((int)uVar74 >= iVar126) * uVar74;
                    iVar129 = auVar101._4_4_;
                    iVar131 = auVar101._12_4_;
                    iVar126 = auVar112._0_4_;
                    iVar77 = auVar101._0_4_;
                    uVar89 = (uint)(iVar77 < iVar126) * iVar126 | (uint)(iVar77 >= iVar126) * iVar77
                    ;
                    iVar126 = auVar112._4_4_;
                    uVar93 = (uint)(iVar129 < iVar126) * iVar126 |
                             (uint)(iVar129 >= iVar126) * iVar129;
                    iVar126 = auVar112._8_4_;
                    iVar129 = auVar101._8_4_;
                    uVar94 = (uint)(iVar129 < iVar126) * iVar126 |
                             (uint)(iVar129 >= iVar126) * iVar129;
                    iVar126 = auVar112._12_4_;
                    uVar95 = (uint)(iVar131 < iVar126) * iVar126 |
                             (uint)(iVar131 >= iVar126) * iVar131;
                    auVar98._0_4_ =
                         ((int)uVar89 < (int)uVar100) * uVar100 |
                         ((int)uVar89 >= (int)uVar100) * uVar89;
                    auVar98._4_4_ =
                         ((int)uVar93 < (int)uVar104) * uVar104 |
                         ((int)uVar93 >= (int)uVar104) * uVar93;
                    auVar98._8_4_ =
                         ((int)uVar94 < (int)uVar105) * uVar105 |
                         ((int)uVar94 >= (int)uVar105) * uVar94;
                    auVar98._12_4_ =
                         ((int)uVar95 < (int)uVar74) * uVar74 |
                         ((int)uVar95 >= (int)uVar74) * uVar95;
                    uVar100 = uVar106 - gap;
                    uVar104 = uVar63 - gap;
                    uVar105 = uVar70 - gap;
                    uVar72 = uVar72 - gap;
                    auVar67._0_4_ = -(uint)((int)uVar100 < (int)(uVar76 - open));
                    auVar67._4_4_ = -(uint)((int)uVar104 < (int)(uVar82 - open));
                    auVar67._8_4_ = -(uint)((int)uVar105 < (int)(uVar84 - open));
                    auVar67._12_4_ = -(uint)((int)uVar72 < (int)(uVar86 - open));
                    iVar126 = movmskps((int)palVar31,auVar67);
                    if (iVar126 == 0xf) goto LAB_0073be84;
                    local_1e8 = blendvps(local_1e8,auVar78,auVar67);
                    local_198 = blendvps(local_198,auVar101,auVar67);
                    auVar78 = blendvps(auVar122,auVar112,auVar67);
                    auVar122._0_4_ = auVar78._0_4_ + 1;
                    auVar122._4_4_ = auVar78._4_4_ + 1;
                    auVar122._8_4_ = auVar78._8_4_ + 1;
                    auVar122._12_4_ = auVar78._12_4_ + 1;
                    piVar2 = (int *)((long)*ptr + lVar34);
                    iVar62 = *piVar2;
                    iVar126 = piVar2[1];
                    iVar129 = piVar2[2];
                    iVar131 = piVar2[3];
                    lVar34 = lVar34 + 0x10;
                    palVar31 = ptr;
                    uVar106 = uVar100;
                    uVar63 = uVar104;
                    uVar70 = uVar105;
                  } while (uVar40 << 4 != lVar34);
                  iVar27 = iVar27 + 1;
                } while (iVar27 != 4);
LAB_0073be84:
                alVar60 = local_1d8[uVar49];
                local_68 = auVar68._0_4_;
                iStack_64 = auVar68._4_4_;
                iStack_60 = auVar68._8_4_;
                iStack_5c = auVar68._12_4_;
                iVar126 = (int)alVar60[0];
                auVar59._0_4_ = -(uint)(local_68 < iVar126);
                iVar129 = alVar60[0]._4_4_;
                auVar59._4_4_ = -(uint)(iStack_64 < iVar129);
                iVar131 = (int)alVar60[1];
                iVar77 = alVar60[1]._4_4_;
                auVar59._8_4_ = -(uint)(iStack_60 < iVar131);
                auVar59._12_4_ = -(uint)(iStack_5c < iVar77);
                auVar24._4_4_ = -(uint)(uVar35 == 2);
                auVar24._0_4_ = -(uint)(uVar35 == 3);
                auVar24._8_4_ = -(uint)(uVar35 == 1);
                auVar24._12_4_ = -(uint)(uVar35 == 0);
                iVar27 = movmskps(iVar27,auVar59 & auVar24);
                if (iVar27 != 0) {
                  iVar41 = (int)uVar33;
                }
                alVar134 = palVar37[uVar49];
                uVar107 = alVar134[1]._4_4_;
                alVar135 = local_1b8[uVar49];
                uVar88 = alVar135[1]._4_4_;
                auVar120 = blendvps(auVar120,(undefined1  [16])alVar134,auVar59);
                alVar136 = b_00[uVar49];
                uVar96 = alVar136[1]._4_4_;
                auVar116 = blendvps(auVar116,(undefined1  [16])alVar135,auVar59);
                auVar50 = blendvps(auVar50,(undefined1  [16])alVar136,auVar59);
                iVar27 = auVar50._12_4_;
                if (iVar28 < 3) {
                  iVar83 = 0;
                  do {
                    lVar34 = alVar60[1];
                    alVar60[1] = alVar60[0];
                    alVar60[0] = alVar60[1] << 0x20;
                    alVar60[1] = lVar34 << 0x20 | alVar60[1] >> 0x20;
                    alVar103[0] = alVar134[0] << 0x20;
                    alVar103[1] = alVar134[1] << 0x20 | alVar134[0] >> 0x20;
                    uVar107 = (undefined4)alVar134[1];
                    alVar81[0] = alVar135[0] << 0x20;
                    alVar81[1] = alVar135[1] << 0x20 | alVar135[0] >> 0x20;
                    uVar88 = (undefined4)alVar135[1];
                    alVar92[0] = alVar136[0] << 0x20;
                    alVar92[1] = alVar136[1] << 0x20 | alVar136[0] >> 0x20;
                    uVar96 = (undefined4)alVar136[1];
                    iVar83 = iVar83 + 1;
                    alVar135 = alVar81;
                    alVar136 = alVar92;
                    alVar134 = alVar103;
                  } while (iVar83 < (int)uVar35);
                }
                *(int *)(*((ppVar29->field_4).trace)->trace_del_table + uVar33 * 4) =
                     (int)(alVar60[1] >> 0x20);
                *(undefined4 *)
                 (*(long *)((long)((ppVar29->field_4).trace)->trace_del_table + 8) + uVar33 * 4) =
                     uVar107;
                *(undefined4 *)
                 (*(long *)((long)((ppVar29->field_4).trace)->trace_del_table + 0x10) + uVar33 * 4)
                     = uVar88;
                *(undefined4 *)
                 (*(long *)((long)((ppVar29->field_4).trace)->trace_del_table + 0x18) + uVar33 * 4)
                     = uVar96;
                auVar68._0_4_ =
                     (uint)(iVar126 < local_68) * local_68 | (uint)(iVar126 >= local_68) * iVar126;
                auVar68._4_4_ =
                     (uint)(iVar129 < iStack_64) * iStack_64 |
                     (uint)(iVar129 >= iStack_64) * iVar129;
                auVar68._8_4_ =
                     (uint)(iVar131 < iStack_60) * iStack_60 |
                     (uint)(iVar131 >= iStack_60) * iVar131;
                auVar68._12_4_ =
                     (uint)(iVar77 < iStack_5c) * iStack_5c | (uint)(iVar77 >= iStack_5c) * iVar77;
                uVar33 = uVar33 + 1;
                palVar30 = local_1d8;
                palVar31 = palVar37;
                palVar32 = palVar39;
                b = local_1b8;
                if (uVar33 == (uint)s2Len) {
                  lVar34 = uVar40 * 4;
                  lVar38 = uVar40 * 8;
                  lVar46 = uVar40 * 0xc;
                  lVar42 = 0;
                  do {
                    puVar3 = (undefined4 *)((long)*local_1d8 + lVar42 * 4);
                    uVar107 = puVar3[1];
                    uVar88 = puVar3[2];
                    uVar96 = puVar3[3];
                    puVar4 = (undefined4 *)((long)*palVar37 + lVar42 * 4);
                    uVar12 = *puVar4;
                    uVar13 = puVar4[1];
                    uVar14 = puVar4[2];
                    uVar15 = puVar4[3];
                    puVar4 = (undefined4 *)((long)*local_1b8 + lVar42 * 4);
                    uVar16 = *puVar4;
                    uVar17 = puVar4[1];
                    uVar18 = puVar4[2];
                    uVar19 = puVar4[3];
                    puVar4 = (undefined4 *)((long)*b_00 + lVar42 * 4);
                    uVar20 = *puVar4;
                    uVar21 = puVar4[1];
                    uVar22 = puVar4[2];
                    uVar23 = puVar4[3];
                    lVar43 = *(long *)((long)((ppVar29->field_4).trace)->trace_del_table + 0x20);
                    *(undefined4 *)(lVar43 + lVar42) = *puVar3;
                    lVar43 = lVar43 + lVar42;
                    *(undefined4 *)(lVar34 + lVar43) = uVar107;
                    *(undefined4 *)(lVar38 + lVar43) = uVar88;
                    *(undefined4 *)(lVar46 + lVar43) = uVar96;
                    lVar43 = *(long *)((long)((ppVar29->field_4).trace)->trace_del_table + 0x28);
                    *(undefined4 *)(lVar43 + lVar42) = uVar12;
                    lVar43 = lVar43 + lVar42;
                    *(undefined4 *)(lVar34 + lVar43) = uVar13;
                    *(undefined4 *)(lVar38 + lVar43) = uVar14;
                    *(undefined4 *)(lVar46 + lVar43) = uVar15;
                    lVar43 = *(long *)((long)((ppVar29->field_4).trace)->trace_del_table + 0x30);
                    *(undefined4 *)(lVar43 + lVar42) = uVar16;
                    lVar43 = lVar43 + lVar42;
                    *(undefined4 *)(lVar34 + lVar43) = uVar17;
                    *(undefined4 *)(lVar38 + lVar43) = uVar18;
                    *(undefined4 *)(lVar46 + lVar43) = uVar19;
                    lVar43 = *(long *)((long)((ppVar29->field_4).trace)->trace_del_table + 0x38);
                    *(undefined4 *)(lVar43 + lVar42) = uVar20;
                    lVar43 = lVar43 + lVar42;
                    *(undefined4 *)(lVar34 + lVar43) = uVar21;
                    *(undefined4 *)(lVar38 + lVar43) = uVar22;
                    *(undefined4 *)(lVar46 + lVar43) = uVar23;
                    lVar42 = lVar42 + 4;
                  } while (lVar34 - lVar42 != 0);
                  if (s2_end == 0) {
                    iVar126 = 0;
                    iVar129 = 0;
                    iVar27 = 0;
                    local_214 = uVar26;
                  }
                  else {
                    if (iVar28 < 3) {
                      iVar126 = 0;
                      auVar78 = auVar68;
                      do {
                        auVar69._0_8_ = auVar78._0_8_ << 0x20;
                        auVar69._8_8_ = auVar78._8_8_ << 0x20 | auVar78._0_8_ >> 0x20;
                        auVar68._12_4_ = auVar78._8_4_;
                        lVar34 = auVar120._8_8_;
                        uVar40 = auVar120._0_8_;
                        auVar120._0_8_ = uVar40 << 0x20;
                        auVar120._8_8_ = lVar34 << 0x20 | uVar40 >> 0x20;
                        lVar34 = auVar116._8_8_;
                        uVar40 = auVar116._0_8_;
                        auVar116._0_8_ = uVar40 << 0x20;
                        auVar116._8_8_ = lVar34 << 0x20 | uVar40 >> 0x20;
                        auVar114._0_8_ = auVar50._0_8_ << 0x20;
                        auVar114._8_8_ = auVar50._8_8_ << 0x20 | auVar50._0_8_ >> 0x20;
                        iVar27 = auVar50._8_4_;
                        iVar126 = iVar126 + 1;
                        auVar78 = auVar69;
                        auVar50 = auVar114;
                      } while (iVar126 < (int)uVar35);
                    }
                    iVar126 = (int)(auVar120._8_8_ >> 0x20);
                    iVar129 = (int)(auVar116._8_8_ >> 0x20);
                    local_214 = auVar68._12_4_;
                  }
                  uVar44 = uVar47;
                  if ((s1_end != 0) && ((uVar45 & 0x7ffffffc) != 0)) {
                    uVar45 = 0;
                    do {
                      auVar68._12_4_ =
                           ((uint)uVar45 & 3) * uVar48 + ((uint)(uVar45 >> 2) & 0x3fffffff);
                      if ((int)auVar68._12_4_ < (int)uVar6) {
                        uVar36 = *(uint *)((long)*local_1d8 + uVar45 * 4);
                        if (((int)local_214 < (int)uVar36) ||
                           (((uVar36 == local_214 && (iVar41 == iVar1)) &&
                            (uVar36 = local_214, (int)auVar68._12_4_ < (int)uVar44)))) {
                          iVar126 = *(int *)((long)*palVar37 + uVar45 * 4);
                          iVar129 = *(int *)((long)*local_1b8 + uVar45 * 4);
                          iVar27 = *(int *)((long)*b_00 + uVar45 * 4);
                          iVar41 = iVar1;
                          uVar44 = auVar68._12_4_;
                          local_214 = uVar36;
                        }
                      }
                      uVar45 = uVar45 + 1;
                    } while ((uVar48 & 0x1fffffff) << 2 != (int)uVar45);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    s1_end = (int)uVar49 * 0x10;
                    uVar45 = local_1d8[uVar49][1];
                    uVar40 = palVar37[uVar49][1];
                    uVar33 = local_1b8[uVar49][1];
                    auVar116._8_8_ = b_00[uVar49][1];
                    if (iVar28 < 3) {
                      s1_end = 0;
                      auVar120._8_8_ = local_1d8[uVar49][0];
                      alVar60[1] = palVar37[uVar49][0];
                      uVar65 = local_1b8[uVar49][0];
                      uVar49 = b_00[uVar49][0];
                      do {
                        uVar45 = uVar45 << 0x20 | auVar120._8_8_ >> 0x20;
                        uVar40 = uVar40 << 0x20 | alVar60[1] >> 0x20;
                        uVar33 = uVar33 << 0x20 | uVar65 >> 0x20;
                        auVar116._8_8_ = auVar116._8_8_ << 0x20 | uVar49 >> 0x20;
                        s1_end = s1_end + 1;
                        auVar120._8_8_ = auVar120._8_8_ << 0x20;
                        alVar60[1] = alVar60[1] << 0x20;
                        uVar65 = uVar65 << 0x20;
                        uVar49 = uVar49 << 0x20;
                      } while (s1_end < (int)uVar35);
                    }
                    local_214 = (uint)(uVar45 >> 0x20);
                    iVar126 = (int)(uVar40 >> 0x20);
                    iVar129 = (int)(uVar33 >> 0x20);
                    iVar27 = (int)(auVar116._8_8_ >> 0x20);
                    iVar41 = iVar1;
                    uVar44 = uVar47;
                  }
                  auVar61._0_4_ = -(uint)((int)local_188 < (int)uVar26);
                  auVar61._4_4_ = -(uint)((int)uStack_184 < (int)uVar26);
                  auVar61._8_4_ = -(uint)((int)uStack_180 < (int)uVar26);
                  auVar61._12_4_ = -(uint)((int)uStack_17c < (int)uVar26);
                  auVar99._0_4_ = -(uint)((int)uVar25 < (int)auVar98._0_4_);
                  auVar99._4_4_ = -(uint)((int)uVar25 < (int)auVar98._4_4_);
                  auVar99._8_4_ = -(uint)((int)uVar25 < (int)auVar98._8_4_);
                  auVar99._12_4_ = -(uint)((int)uVar25 < (int)auVar98._12_4_);
                  iVar28 = movmskps(s1_end,auVar99 | auVar61);
                  if (iVar28 != 0) {
                    *(byte *)&ppVar29->flag = (byte)ppVar29->flag | 0x40;
                    local_214 = 0;
                    iVar126 = 0;
                    iVar129 = 0;
                    iVar27 = 0;
                    iVar41 = 0;
                    uVar44 = 0;
                  }
                  ppVar29->score = local_214;
                  ppVar29->end_query = uVar44;
                  ppVar29->end_ref = iVar41;
                  ((ppVar29->field_4).stats)->matches = iVar126;
                  ((ppVar29->field_4).stats)->similar = iVar129;
                  ((ppVar29->field_4).stats)->length = iVar27;
                  parasail_free(ptr_03);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(b_01);
                  parasail_free(ptr_02);
                  parasail_free(palVar39);
                  parasail_free(b_00);
                  parasail_free(ptr_01);
                  parasail_free(local_1b8);
                  parasail_free(ptr_00);
                  parasail_free(palVar37);
                  parasail_free(ptr);
                  parasail_free(local_1d8);
                  return ppVar29;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi32(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
        result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
            vMaxHM = _mm_slli_si128(vMaxHM, 4);
            vMaxHS = _mm_slli_si128(vMaxHS, 4);
            vMaxHL = _mm_slli_si128(vMaxHL, 4);
        }
        end_query = s1Len-1;
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        matches = (int32_t) _mm_extract_epi32(vMaxHM, 3);
        similar = (int32_t) _mm_extract_epi32(vMaxHS, 3);
        length = (int32_t) _mm_extract_epi32(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t *m = (int32_t*)pvHMStore;
        int32_t *s = (int32_t*)pvHSStore;
        int32_t *l = (int32_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}